

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix3d * tinyusdz::to_matrix3x3(matrix3d *__return_storage_ptr__,quatd *q)

{
  const_reference x_;
  const_reference y_;
  const_reference z_;
  V *this;
  double *__src;
  vec<double,_4> local_78;
  undefined1 local_58 [8];
  double3x3 m33;
  quatd *q_local;
  
  m33.z.z = (double)q;
  x_ = ::std::array<double,_3UL>::operator[](&q->imag,0);
  y_ = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)m33.z.z,1);
  z_ = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)m33.z.z,2);
  linalg::vec<double,_4>::vec(&local_78,x_,y_,z_,(double *)((long)m33.z.z + 0x18));
  linalg::qmat<double>((mat<double,_3,_3> *)local_58,&local_78);
  value::matrix3d::matrix3d(__return_storage_ptr__);
  Identity(__return_storage_ptr__);
  this = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,0);
  __src = linalg::vec<double,_3>::operator[](this,0);
  memcpy(__return_storage_ptr__,__src,0x48);
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d to_matrix3x3(const value::quatd &q) {
  double3x3 m33 =
      linalg::qmat<double>({q.imag[0], q.imag[1], q.imag[2], q.real});

  value::matrix3d m;
  Identity(&m);

  memcpy(m.m, &m33[0][0], sizeof(double) * 3 * 3);

  return m;
}